

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratedFileStream.cxx
# Opt level: O3

int __thiscall
cmGeneratedFileStreamBase::CompressFile(cmGeneratedFileStreamBase *this,char *oldname,char *newname)

{
  int iVar1;
  gzFile file;
  FILE *__stream;
  size_t sVar2;
  char buffer [1024];
  allocator local_429;
  string local_428 [32];
  
  file = cm_zlib_gzopen(newname,"w");
  iVar1 = 0;
  if (file != (gzFile)0x0) {
    std::__cxx11::string::string((string *)local_428,oldname,&local_429);
    __stream = (FILE *)cmsys::SystemTools::Fopen(local_428,"r");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428[0]._M_dataplus._M_p != &local_428[0].field_2) {
      operator_delete(local_428[0]._M_dataplus._M_p,local_428[0].field_2._M_allocated_capacity + 1);
    }
    iVar1 = 0;
    if (__stream != (FILE *)0x0) {
      do {
        sVar2 = fread(local_428,1,0x400,__stream);
        if (sVar2 == 0) {
          iVar1 = 1;
          goto LAB_002f4c23;
        }
        iVar1 = cm_zlib_gzwrite(file,local_428,(uint)sVar2);
      } while (iVar1 != 0);
      iVar1 = 0;
LAB_002f4c23:
      fclose(__stream);
      cm_zlib_gzclose(file);
    }
  }
  return iVar1;
}

Assistant:

int cmGeneratedFileStreamBase::CompressFile(const char* oldname,
                                            const char* newname)
{
  gzFile gf = gzopen(newname, "w");
  if ( !gf )
    {
    return 0;
    }
  FILE* ifs = cmsys::SystemTools::Fopen(oldname, "r");
  if ( !ifs )
    {
    return 0;
    }
  size_t res;
  const size_t BUFFER_SIZE = 1024;
  char buffer[BUFFER_SIZE];
  while ( (res = fread(buffer, 1, BUFFER_SIZE, ifs)) > 0 )
    {
    if ( !gzwrite(gf, buffer, static_cast<int>(res)) )
      {
      fclose(ifs);
      gzclose(gf);
      return 0;
      }
    }
  fclose(ifs);
  gzclose(gf);
  return 1;
}